

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O2

set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
* __thiscall
spvtools::opt::LoopDependenceAnalysis::CollectLoops
          (set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
           *__return_storage_ptr__,LoopDependenceAnalysis *this,
          vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
          *recurrent_nodes)

{
  _Rb_tree_header *p_Var1;
  pointer ppSVar2;
  Loop *local_28;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  for (ppSVar2 = (recurrent_nodes->
                 super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      ppSVar2 !=
      (recurrent_nodes->
      super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
      )._M_impl.super__Vector_impl_data._M_finish; ppSVar2 = ppSVar2 + 1) {
    local_28 = (*ppSVar2)->loop_;
    std::
    _Rb_tree<spvtools::opt::Loop_const*,spvtools::opt::Loop_const*,std::_Identity<spvtools::opt::Loop_const*>,std::less<spvtools::opt::Loop_const*>,std::allocator<spvtools::opt::Loop_const*>>
    ::_M_insert_unique<spvtools::opt::Loop_const*>
              ((_Rb_tree<spvtools::opt::Loop_const*,spvtools::opt::Loop_const*,std::_Identity<spvtools::opt::Loop_const*>,std::less<spvtools::opt::Loop_const*>,std::allocator<spvtools::opt::Loop_const*>>
                *)__return_storage_ptr__,&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<const Loop*> LoopDependenceAnalysis::CollectLoops(
    const std::vector<SERecurrentNode*>& recurrent_nodes) {
  // We don't handle loops with more than one induction variable. Therefore we
  // can identify the number of induction variables by collecting all of the
  // loops the collected recurrent nodes belong to.
  std::set<const Loop*> loops{};
  for (auto recurrent_nodes_it = recurrent_nodes.begin();
       recurrent_nodes_it != recurrent_nodes.end(); ++recurrent_nodes_it) {
    loops.insert((*recurrent_nodes_it)->GetLoop());
  }

  return loops;
}